

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O3

reference __thiscall
slang::
SmallVectorBase<std::pair<slang::ast::Compilation::DefinitionLookupResult,slang::syntax::HierarchicalInstanceSyntax_const*>>
::
emplace_back<std::pair<slang::ast::Compilation::DefinitionLookupResult,slang::syntax::HierarchicalInstanceSyntax_const*>>
          (SmallVectorBase<std::pair<slang::ast::Compilation::DefinitionLookupResult,slang::syntax::HierarchicalInstanceSyntax_const*>>
           *this,pair<slang::ast::Compilation::DefinitionLookupResult,_const_slang::syntax::HierarchicalInstanceSyntax_*>
                 *args)

{
  ulong uVar1;
  SmallVectorBase<std::pair<slang::ast::Compilation::DefinitionLookupResult,slang::syntax::HierarchicalInstanceSyntax_const*>>
  *p;
  Symbol *pSVar2;
  ConfigBlockSymbol *pCVar3;
  HierarchicalInstanceSyntax *pHVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 *puVar8;
  undefined8 *puVar9;
  SmallVectorBase<std::pair<slang::ast::Compilation::DefinitionLookupResult,slang::syntax::HierarchicalInstanceSyntax_const*>>
  *pSVar10;
  long lVar11;
  SmallVectorBase<std::pair<slang::ast::Compilation::DefinitionLookupResult,slang::syntax::HierarchicalInstanceSyntax_const*>>
  *__src;
  long lVar12;
  ulong uVar13;
  
  __src = (SmallVectorBase<std::pair<slang::ast::Compilation::DefinitionLookupResult,slang::syntax::HierarchicalInstanceSyntax_const*>>
           *)(*(long *)(this + 8) * 0x20 + *(long *)this);
  if (*(long *)(this + 8) != *(long *)(this + 0x10)) {
    pSVar2 = (args->first).definition;
    pCVar3 = (args->first).configRoot;
    pHVar4 = args->second;
    *(ConfigRule **)(__src + 0x10) = (args->first).configRule;
    *(HierarchicalInstanceSyntax **)(__src + 0x18) = pHVar4;
    *(Symbol **)__src = pSVar2;
    *(ConfigBlockSymbol **)(__src + 8) = pCVar3;
    lVar12 = *(long *)(this + 8);
    *(long *)(this + 8) = lVar12 + 1;
    return (reference)(*(long *)this + (lVar12 + 1) * 0x20 + -0x20);
  }
  if (*(long *)(this + 8) == 0x3ffffffffffffff) {
    detail::throwLengthError();
  }
  uVar13 = *(long *)(this + 8) + 1;
  uVar1 = *(ulong *)(this + 0x10);
  if (uVar13 < uVar1 * 2) {
    uVar13 = uVar1 * 2;
  }
  if (0x3ffffffffffffff - uVar1 < uVar1) {
    uVar13 = 0x3ffffffffffffff;
  }
  lVar11 = (long)__src - *(long *)this;
  puVar8 = (undefined8 *)operator_new(uVar13 << 5);
  pSVar2 = (args->first).definition;
  pCVar3 = (args->first).configRoot;
  pHVar4 = args->second;
  puVar9 = (undefined8 *)((long)puVar8 + lVar11 + 0x10);
  *puVar9 = (args->first).configRule;
  puVar9[1] = pHVar4;
  *(undefined8 *)((long)puVar8 + lVar11) = pSVar2;
  ((undefined8 *)((long)puVar8 + lVar11))[1] = pCVar3;
  p = *(SmallVectorBase<std::pair<slang::ast::Compilation::DefinitionLookupResult,slang::syntax::HierarchicalInstanceSyntax_const*>>
        **)this;
  lVar12 = *(long *)(this + 8);
  pSVar10 = p;
  puVar9 = puVar8;
  if (p + (lVar12 * 0x20 - (long)__src) ==
      (SmallVectorBase<std::pair<slang::ast::Compilation::DefinitionLookupResult,slang::syntax::HierarchicalInstanceSyntax_const*>>
       *)0x0) {
    if (lVar12 != 0) {
      do {
        uVar5 = *(undefined8 *)pSVar10;
        uVar6 = *(undefined8 *)(pSVar10 + 8);
        uVar7 = *(undefined8 *)(pSVar10 + 0x18);
        puVar9[2] = *(undefined8 *)(pSVar10 + 0x10);
        puVar9[3] = uVar7;
        *puVar9 = uVar5;
        puVar9[1] = uVar6;
        pSVar10 = pSVar10 + 0x20;
        puVar9 = puVar9 + 4;
      } while (pSVar10 != __src);
    }
  }
  else {
    for (; pSVar10 != __src; pSVar10 = pSVar10 + 0x20) {
      uVar5 = *(undefined8 *)pSVar10;
      uVar6 = *(undefined8 *)(pSVar10 + 8);
      uVar7 = *(undefined8 *)(pSVar10 + 0x18);
      puVar9[2] = *(undefined8 *)(pSVar10 + 0x10);
      puVar9[3] = uVar7;
      *puVar9 = uVar5;
      puVar9[1] = uVar6;
      puVar9 = puVar9 + 4;
    }
    memcpy((void *)((long)puVar8 + lVar11 + 0x20),__src,
           ((ulong)(p + (lVar12 * 0x20 - (long)__src) + -0x20) & 0xffffffffffffffe0) + 0x20);
  }
  if (p != this + 0x18) {
    operator_delete(p);
    lVar12 = *(long *)(this + 8);
  }
  *(long *)(this + 8) = lVar12 + 1;
  *(ulong *)(this + 0x10) = uVar13;
  *(undefined8 **)this = puVar8;
  return (reference)((long)puVar8 + lVar11);
}

Assistant:

reference emplace_back(Args&&... args) {
        if (len == cap)
            return *emplaceRealloc(end(), std::forward<Args>(args)...);

        new (end()) T(std::forward<Args>(args)...);
        len++;
        return back();
    }